

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoder.c
# Opt level: O0

void av1_post_encode_updates(AV1_COMP *cpi,AV1_COMP_DATA *cpi_data)

{
  int iVar1;
  AV1_COMP *in_RSI;
  AV1_COMP *in_RDI;
  AV1_COMP *unaff_retaddr;
  AV1_COMMON *cm;
  AV1_PRIMARY *ppi;
  uint64_t in_stack_00000038;
  AV1_COMP *in_stack_00000040;
  int64_t in_stack_000000e8;
  int64_t in_stack_000000f0;
  size_t in_stack_000000f8;
  AV1_COMP *in_stack_00000100;
  AV1_COMP *in_stack_00000130;
  AV1_COMP *in_stack_00000160;
  AV1_COMP *cpi_00;
  AV1_PRIMARY *fb_of_context_type;
  
  fb_of_context_type = in_RDI->ppi;
  cpi_00 = (AV1_COMP *)&in_RDI->common;
  update_gm_stats(in_RDI);
  if (((in_RDI->twopass_frame).this_frame != (FIRSTPASS_STATS *)0x0) &&
     (((fb_of_context_type->twopass).stats_buf_ctx)->total_left_stats != (FIRSTPASS_STATS *)0x0)) {
    subtract_stats(((fb_of_context_type->twopass).stats_buf_ctx)->total_left_stats,
                   (in_RDI->twopass_frame).this_frame);
  }
  iVar1 = is_stat_generation_stage(in_RDI);
  if ((iVar1 == 0) && ((in_RDI->is_dropped_frame & 1U) == 0)) {
    if (((fb_of_context_type->gf_group).frame_parallel_level[in_RDI->gf_frame_index] == 2) &&
       (((fb_of_context_type->gf_group).frame_parallel_level[(int)(in_RDI->gf_frame_index - 1)] == 1
        && ((fb_of_context_type->gf_group).update_type[(int)(in_RDI->gf_frame_index - 1)] == '\x06')
        ))) {
      memcpy((cpi_00->enc_quant_dequant_params).quants.y_quant + 0x19,
             fb_of_context_type->ref_frame_map_copy,0x40);
    }
    refresh_reference_frames(in_RSI);
    if (((fb_of_context_type->gf_group).frame_parallel_level[in_RDI->gf_frame_index] == 1) &&
       ((fb_of_context_type->gf_group).update_type[in_RDI->gf_frame_index] == '\x06')) {
      memcpy(fb_of_context_type->ref_frame_map_copy,
             (cpi_00->enc_quant_dequant_params).quants.y_quant + 0x19,0x40);
    }
    av1_rc_postencode_update(in_stack_00000040,in_stack_00000038);
  }
  if (*(int *)(in_RSI->enc_quant_dequant_params).quants.y_quant[3] == 1) {
    av1_lookahead_pop((lookahead_ctx *)in_RSI,(int)((ulong)fb_of_context_type >> 0x20),
                      (COMPRESSOR_STAGE)((ulong)fb_of_context_type >> 0x18));
  }
  if ((in_RDI->common).show_frame != 0) {
    in_RDI->ppi->ts_start_last_show_frame =
         *(int64_t *)(in_RSI->enc_quant_dequant_params).quants.y_quant[1];
    in_RDI->ppi->ts_end_last_show_frame =
         *(int64_t *)((in_RSI->enc_quant_dequant_params).quants.y_quant[1] + 4);
  }
  if (((fb_of_context_type->level_params).keep_level_stats != 0) &&
     (iVar1 = is_stat_generation_stage(in_RDI), iVar1 == 0)) {
    if ((((CurrentFrame *)&cpi_00->ppi)->frame_type == '\0') &&
       ((fb_of_context_type->gf_group).refbuf_state[in_RDI->gf_frame_index] == '\0')) {
      av1_init_level_info(cpi);
    }
    av1_update_level_info(in_stack_00000100,in_stack_000000f8,in_stack_000000f0,in_stack_000000e8);
  }
  iVar1 = is_stat_generation_stage(in_RDI);
  if (iVar1 == 0) {
    iVar1 = has_no_stats_stage(in_RDI);
    if (iVar1 == 0) {
      av1_twopass_postencode_update(in_stack_00000160);
    }
    update_fb_of_context_type(in_RSI,(int *)fb_of_context_type);
    update_rc_counts((AV1_COMP *)0x230c27);
    update_end_of_frame_stats(cpi_00);
  }
  if (((fb_of_context_type->rtc_ref).set_ref_frame_config != 0) &&
     ((in_RDI->is_dropped_frame & 1U) == 0)) {
    av1_svc_update_buffer_slot_refreshed(in_RDI);
    av1_svc_set_reference_was_previous(in_RDI);
  }
  if (fb_of_context_type->use_svc != 0) {
    av1_save_layer_context(unaff_retaddr);
  }
  if (((fb_of_context_type->b_calculate_psnr != 0) &&
      (*(long *)(in_RSI->enc_quant_dequant_params).quants.y_quant[0] != 0)) &&
     ((*(int *)((cpi_00->enc_quant_dequant_params).quants.y_quant[0x1d] + 4) != 0 ||
      ((iVar1 = is_stat_generation_stage(in_RDI), iVar1 == 0 &&
       (*(int *)(cpi_00->enc_quant_dequant_params).quants.y_quant[0x1d] != 0)))))) {
    generate_psnr_packet(in_stack_00000130);
  }
  return;
}

Assistant:

void av1_post_encode_updates(AV1_COMP *const cpi,
                             const AV1_COMP_DATA *const cpi_data) {
  AV1_PRIMARY *const ppi = cpi->ppi;
  AV1_COMMON *const cm = &cpi->common;

  update_gm_stats(cpi);

#if !CONFIG_REALTIME_ONLY
  // Update the total stats remaining structure.
  if (cpi->twopass_frame.this_frame != NULL &&
      ppi->twopass.stats_buf_ctx->total_left_stats) {
    subtract_stats(ppi->twopass.stats_buf_ctx->total_left_stats,
                   cpi->twopass_frame.this_frame);
  }
#endif

#if CONFIG_OUTPUT_FRAME_SIZE
  FILE *f = fopen("frame_sizes.csv", "a");
  fprintf(f, "%d,", 8 * (int)cpi_data->frame_size);
  fprintf(f, "%d\n", cm->quant_params.base_qindex);
  fclose(f);
#endif  // CONFIG_OUTPUT_FRAME_SIZE

  if (!is_stat_generation_stage(cpi) && !cpi->is_dropped_frame) {
    // Before calling refresh_reference_frames(), copy ppi->ref_frame_map_copy
    // to cm->ref_frame_map for frame_parallel_level 2 frame in a parallel
    // encode set of lower layer frames.
    // TODO(Remya): Move ref_frame_map from AV1_COMMON to AV1_PRIMARY to avoid
    // copy.
    if (ppi->gf_group.frame_parallel_level[cpi->gf_frame_index] == 2 &&
        ppi->gf_group.frame_parallel_level[cpi->gf_frame_index - 1] == 1 &&
        ppi->gf_group.update_type[cpi->gf_frame_index - 1] ==
            INTNL_ARF_UPDATE) {
      memcpy(cm->ref_frame_map, ppi->ref_frame_map_copy,
             sizeof(cm->ref_frame_map));
    }
    refresh_reference_frames(cpi);
    // For frame_parallel_level 1 frame in a parallel encode set of lower layer
    // frames, store the updated cm->ref_frame_map in ppi->ref_frame_map_copy.
    if (ppi->gf_group.frame_parallel_level[cpi->gf_frame_index] == 1 &&
        ppi->gf_group.update_type[cpi->gf_frame_index] == INTNL_ARF_UPDATE) {
      memcpy(ppi->ref_frame_map_copy, cm->ref_frame_map,
             sizeof(cm->ref_frame_map));
    }
    av1_rc_postencode_update(cpi, cpi_data->frame_size);
  }

  if (cpi_data->pop_lookahead == 1) {
    av1_lookahead_pop(cpi->ppi->lookahead, cpi_data->flush,
                      cpi->compressor_stage);
  }
  if (cpi->common.show_frame) {
    cpi->ppi->ts_start_last_show_frame = cpi_data->ts_frame_start;
    cpi->ppi->ts_end_last_show_frame = cpi_data->ts_frame_end;
  }
  if (ppi->level_params.keep_level_stats && !is_stat_generation_stage(cpi)) {
    // Initialize level info. at the beginning of each sequence.
    if (cm->current_frame.frame_type == KEY_FRAME &&
        ppi->gf_group.refbuf_state[cpi->gf_frame_index] == REFBUF_RESET) {
      av1_init_level_info(cpi);
    }
    av1_update_level_info(cpi, cpi_data->frame_size, cpi_data->ts_frame_start,
                          cpi_data->ts_frame_end);
  }

  if (!is_stat_generation_stage(cpi)) {
#if !CONFIG_REALTIME_ONLY
    if (!has_no_stats_stage(cpi)) av1_twopass_postencode_update(cpi);
#endif
    update_fb_of_context_type(cpi, ppi->fb_of_context_type);
    update_rc_counts(cpi);
    update_end_of_frame_stats(cpi);
  }

#if CONFIG_THREE_PASS
  if (cpi->oxcf.pass == AOM_RC_THIRD_PASS && cpi->third_pass_ctx) {
    av1_pop_third_pass_info(cpi->third_pass_ctx);
  }
#endif

  if (ppi->rtc_ref.set_ref_frame_config && !cpi->is_dropped_frame) {
    av1_svc_update_buffer_slot_refreshed(cpi);
    av1_svc_set_reference_was_previous(cpi);
  }

  if (ppi->use_svc) av1_save_layer_context(cpi);

  // Note *size = 0 indicates a dropped frame for which psnr is not calculated
  if (ppi->b_calculate_psnr && cpi_data->frame_size > 0) {
    if (cm->show_existing_frame ||
        (!is_stat_generation_stage(cpi) && cm->show_frame)) {
      generate_psnr_packet(cpi);
    }
  }

#if CONFIG_INTERNAL_STATS
  if (!is_stat_generation_stage(cpi)) {
    compute_internal_stats(cpi, (int)cpi_data->frame_size);
  }
#endif  // CONFIG_INTERNAL_STATS

#if CONFIG_THREE_PASS
  // Write frame info. Subtract 1 from frame index since if was incremented in
  // update_rc_counts.
  av1_write_second_pass_per_frame_info(cpi, cpi->gf_frame_index - 1);
#endif
}